

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O1

void __thiscall FDrawInfo::ClearBuffers(FDrawInfo *this)

{
  uint uVar1;
  gl_subsectorrendernode *pgVar2;
  gl_subsectorrendernode *pgVar3;
  ulong uVar4;
  
  if ((this->otherfloorplanes).Count != 0) {
    uVar4 = 0;
    do {
      pgVar3 = (this->otherfloorplanes).Array[uVar4];
      while (pgVar3 != (gl_subsectorrendernode *)0x0) {
        pgVar2 = pgVar3->next;
        operator_delete(pgVar3,0x10);
        pgVar3 = pgVar2;
      }
      uVar4 = uVar4 + 1;
      uVar1 = (this->otherfloorplanes).Count;
    } while (uVar4 < uVar1);
    if (uVar1 != 0) {
      (this->otherfloorplanes).Count = 0;
    }
  }
  if ((this->otherceilingplanes).Count != 0) {
    uVar4 = 0;
    do {
      pgVar3 = (this->otherceilingplanes).Array[uVar4];
      while (pgVar3 != (gl_subsectorrendernode *)0x0) {
        pgVar2 = pgVar3->next;
        operator_delete(pgVar3,0x10);
        pgVar3 = pgVar2;
      }
      uVar4 = uVar4 + 1;
      uVar1 = (this->otherceilingplanes).Count;
    } while (uVar4 < uVar1);
    if (uVar1 != 0) {
      (this->otherceilingplanes).Count = 0;
    }
  }
  if ((this->MissingUpperTextures).Count != 0) {
    (this->MissingUpperTextures).Count = 0;
  }
  if ((this->MissingLowerTextures).Count != 0) {
    (this->MissingLowerTextures).Count = 0;
  }
  if ((this->MissingUpperSegs).Count != 0) {
    (this->MissingUpperSegs).Count = 0;
  }
  if ((this->MissingLowerSegs).Count != 0) {
    (this->MissingLowerSegs).Count = 0;
  }
  if ((this->SubsectorHacks).Count != 0) {
    (this->SubsectorHacks).Count = 0;
  }
  if ((this->CeilingStacks).Count != 0) {
    (this->CeilingStacks).Count = 0;
  }
  if ((this->FloorStacks).Count != 0) {
    (this->FloorStacks).Count = 0;
  }
  if ((this->HandledSubsectors).Count != 0) {
    (this->HandledSubsectors).Count = 0;
  }
  return;
}

Assistant:

void FDrawInfo::ClearBuffers()
{
	for(unsigned int i=0;i< otherfloorplanes.Size();i++)
	{
		gl_subsectorrendernode * node = otherfloorplanes[i];
		while (node)
		{
			gl_subsectorrendernode * n = node;
			node = node->next;
			SSR_List.Release(n);
		}
	}
	otherfloorplanes.Clear();

	for(unsigned int i=0;i< otherceilingplanes.Size();i++)
	{
		gl_subsectorrendernode * node = otherceilingplanes[i];
		while (node)
		{
			gl_subsectorrendernode * n = node;
			node = node->next;
			SSR_List.Release(n);
		}
	}
	otherceilingplanes.Clear();

	// clear all the lists that might not have been cleared already
	MissingUpperTextures.Clear();
	MissingLowerTextures.Clear();
	MissingUpperSegs.Clear();
	MissingLowerSegs.Clear();
	SubsectorHacks.Clear();
	CeilingStacks.Clear();
	FloorStacks.Clear();
	HandledSubsectors.Clear();

}